

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Matcher_Test::iu_SyntaxTest_x_iutest_x_Matcher_Test
          (iu_SyntaxTest_x_iutest_x_Matcher_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0039e3f0;
  return;
}

Assistant:

IUTEST(SyntaxTest, Matcher)
{
    ::std::vector<int> v;
    v.push_back(0);
    v.push_back(1);
    v.push_back(2);
    int a[3] = { 0, 1, 2 };
    int b[4] = { 0, 1, 2, 3 };
    X x(0, 1);
    int z=1;
    IUTEST_EXPECT_THAT(a, ::iutest::Contains(0));
    IUTEST_EXPECT_THAT(a, ::iutest::Contains(::iutest::Lt(10)));
#if IUTEST_HAS_MATCHER_EACH
    IUTEST_EXPECT_THAT(a, ::iutest::Each(::iutest::Le(10)));
    IUTEST_EXPECT_THAT(a, ::iutest::Each(::iutest::_));
    IUTEST_EXPECT_THAT(a, ::iutest::Each(::iutest::A<int>()));
#endif
    IUTEST_EXPECT_THAT(&x, ::iutest::Field(&X::a, 0));
    IUTEST_EXPECT_THAT(x, ::iutest::Field(&X::a, 0));
    IUTEST_EXPECT_THAT(&x, ::iutest::Property(&X::GetA, 0));
    IUTEST_EXPECT_THAT(x, ::iutest::Property(&X::GetA, 0));
    IUTEST_EXPECT_THAT(a, ::iutest::ElementsAreArray(a));
    IUTEST_EXPECT_THAT(v, ::iutest::ElementsAreArray(a));
#if !defined(IUTEST_USE_GMOCK) || (GMOCK_VER >= 0x01070000)
    IUTEST_EXPECT_THAT(a, ::iutest::ElementsAreArray(v));
    IUTEST_EXPECT_THAT(v, ::iutest::ElementsAreArray(v));
#endif
    IUTEST_EXPECT_THAT(a, ::iutest::ElementsAreArray(b, 3));
#if IUTEST_HAS_INITIALIZER_LIST
    IUTEST_EXPECT_THAT(a, ::iutest::ElementsAreArray({0, 1, 2}));
#endif
    IUTEST_EXPECT_THAT(1, ::iutest::ResultOf(X2, 2));
    IUTEST_EXPECT_THAT(1, ::iutest::ResultOf(X2, ::iutest::Gt(1)));
    IUTEST_EXPECT_THAT(z, ::iutest::TypedEq<int>(1.0));
}